

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O0

void mono16_converter(uchar *from,uchar *to,int w,int delta)

{
  byte bVar1;
  byte bVar2;
  uint local_38;
  uchar m;
  int r;
  int iStack_2c;
  uchar mask;
  int td;
  int d;
  unsigned_short *t;
  int delta_local;
  int w_local;
  uchar *to_local;
  uchar *from_local;
  
  if (dir == 0) {
    r = 1;
    iStack_2c = delta;
    _td = to;
    to_local = from;
  }
  else {
    to_local = from + (w + -1) * delta;
    _td = to + (long)(w + -1) * 2;
    iStack_2c = -delta;
    r = -1;
  }
  dir = (int)(dir == 0);
  bVar1 = fl_redmask & fl_greenmask & fl_bluemask;
  local_38 = ri;
  t._4_4_ = w;
  while (t._4_4_ != 0) {
    local_38 = (local_38 & (bVar1 ^ 0xffffffff)) + (uint)*to_local;
    if (0xff < (int)local_38) {
      local_38 = 0xff;
    }
    bVar2 = (byte)local_38 & bVar1;
    *(short *)_td =
         (short)((int)(((uint)bVar2 << ((byte)fl_redshift & 0x1f)) +
                       ((uint)bVar2 << ((byte)fl_greenshift & 0x1f)) +
                      ((uint)bVar2 << ((byte)fl_blueshift & 0x1f))) >> ((byte)fl_extrashift & 0x1f))
    ;
    to_local = to_local + iStack_2c;
    _td = _td + (long)r * 2;
    t._4_4_ = t._4_4_ + -1;
  }
  ri = local_38;
  return;
}

Assistant:

static void mono16_converter(const uchar *from,uchar *to,int w, int delta) {
  OUTTYPE *t = (OUTTYPE *)to;
  int d, td;
  if (dir) {
    dir = 0;
    from = from+(w-1)*delta;
    t = t+(w-1)*OUTSIZE;
    d = -delta;
    td = -OUTSIZE;
  } else {
    dir = 1;
    d = delta;
    td = OUTSIZE;
  }
  uchar mask = fl_redmask & fl_greenmask & fl_bluemask;
  int r=ri;
  for (; w--; from += d, t += td) {
    r = (r&~mask) + *from; if (r > 255) r = 255;
    uchar m = r&mask;
    OUTASSIGN((
      (m<<fl_redshift)+
      (m<<fl_greenshift)+
      (m<<fl_blueshift)
      ) >> fl_extrashift);
  }
  ri = r;
}